

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1ddac71::AV1LbdInvTxfm2d_match_Test::TestBody(AV1LbdInvTxfm2d_match_Test *this)

{
  long lVar1;
  int j;
  ulong uVar2;
  int iVar3;
  
  uVar2 = 0;
  do {
    iVar3 = (uint)((0x18608UL >> (uVar2 & 0x3f) & 1) == 0) * 4 + 1;
    if ((0x61810UL >> (uVar2 & 0x3f) & 1) != 0) {
      iVar3 = 0;
    }
    lVar1 = 0;
    do {
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)(uint)(iVar3 << 6) + lVar1 * 4) != 0) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (&this->super_AV1LbdInvTxfm2d,(TxType)lVar1,(TxSize)uVar2,1,0);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x13);
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, match) {
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    for (int i = 0; i < (int)TX_TYPES; ++i) {
      if (libaom_test::IsTxSizeTypeValid(static_cast<TxSize>(j),
                                         static_cast<TxType>(i))) {
        RunAV1InvTxfm2dTest(static_cast<TxType>(i), static_cast<TxSize>(j), 1);
      }
    }
  }
}